

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_integer_testing.cpp
# Opt level: O0

void __thiscall
correctness_mul_merge_randomized_Test::~correctness_mul_merge_randomized_Test
          (correctness_mul_merge_randomized_Test *this)

{
  void *in_RDI;
  
  ~correctness_mul_merge_randomized_Test((correctness_mul_merge_randomized_Test *)0x128118);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(correctness, mul_merge_randomized)
{
    for (unsigned itn = 0; itn != number_of_iterations; ++itn)
    {
        std::vector<big_integer> x;
        for (size_t i = 0; i != number_of_multipliers; ++i)
            x.push_back(myrand());

        big_integer a = merge_all(x);
        big_integer b = merge_all(x);

        EXPECT_TRUE(a == b);
    }
}